

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_tcp_connection.cc
# Opt level: O2

int __thiscall AliTcpConnection::Connect(AliTcpConnection *this)

{
  char *__name;
  addrinfo *paVar1;
  int iVar2;
  addrinfo **__pai;
  addrinfo *res0;
  sockaddr_in addr;
  char local_78 [32];
  addrinfo local_58;
  
  iVar2 = socket(2,1,6);
  this->fd_ = iVar2;
  addr.sin_family = 0;
  addr.sin_port = 0;
  addr.sin_addr.s_addr = 0;
  addr.sin_zero[0] = '\0';
  addr.sin_zero[1] = '\0';
  addr.sin_zero[2] = '\0';
  addr.sin_zero[3] = '\0';
  addr.sin_zero[4] = '\0';
  addr.sin_zero[5] = '\0';
  addr.sin_zero[6] = '\0';
  addr.sin_zero[7] = '\0';
  __name = (this->host_)._M_dataplus._M_p;
  local_78[0x10] = '\0';
  local_78[0x11] = '\0';
  local_78[0x12] = '\0';
  local_78[0x13] = '\0';
  local_78[0x14] = '\0';
  local_78[0x15] = '\0';
  local_78[0x16] = '\0';
  local_78[0x17] = '\0';
  local_78[0x18] = '\0';
  local_78[0x19] = '\0';
  local_78[0x1a] = '\0';
  local_78[0x1b] = '\0';
  local_78[0x1c] = '\0';
  local_78[0x1d] = '\0';
  local_78[0x1e] = '\0';
  local_78[0x1f] = '\0';
  local_78[0] = '\0';
  local_78[1] = '\0';
  local_78[2] = '\0';
  local_78[3] = '\0';
  local_78[4] = '\0';
  local_78[5] = '\0';
  local_78[6] = '\0';
  local_78[7] = '\0';
  local_78[8] = '\0';
  local_78[9] = '\0';
  local_78[10] = '\0';
  local_78[0xb] = '\0';
  local_78[0xc] = '\0';
  local_78[0xd] = '\0';
  local_78[0xe] = '\0';
  local_78[0xf] = '\0';
  snprintf(local_78,0x20,"%d",(ulong)(uint)this->port_);
  local_58.ai_addrlen = 0;
  local_58._20_4_ = 0;
  local_58.ai_addr = (sockaddr *)0x0;
  local_58.ai_canonname = (char *)0x0;
  local_58.ai_next = (addrinfo *)0x0;
  local_58.ai_socktype = 1;
  local_58.ai_protocol = 6;
  local_58.ai_flags = 1;
  local_58.ai_family = 0;
  __pai = (addrinfo **)&res0;
  iVar2 = getaddrinfo(__name,local_78,&local_58,__pai);
  if (iVar2 == 0) {
    while (paVar1 = *__pai, paVar1 != (addrinfo *)0x0) {
      if (paVar1->ai_family == 10) {
        freeaddrinfo((addrinfo *)res0);
        goto LAB_0012cefc;
      }
      if (paVar1->ai_family == 2) {
        addr._0_8_ = *(undefined8 *)paVar1->ai_addr;
        addr.sin_zero = *(uchar (*) [8])(paVar1->ai_addr->sa_data + 6);
        break;
      }
      __pai = &paVar1->ai_next;
    }
    freeaddrinfo((addrinfo *)res0);
    iVar2 = connect(this->fd_,(sockaddr *)&addr,0x10);
  }
  else {
LAB_0012cefc:
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int AliTcpConnection::Connect() {
  fd_ = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);
  sockaddr_in addr = {};
  if(resolve_dns(host_.c_str(), port_, (sockaddr*)&addr) != 0) {\
    goto err_failed;
  }

  return ::connect(fd_, (sockaddr*)&addr, sizeof(sockaddr_in));
err_failed:
  return -1;
}